

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictors.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *filter;
  char *filename;
  int iVar1;
  uint columns_00;
  uint bits_per_sample_00;
  uint samples_per_pixel_00;
  ostream *poVar2;
  int bits_per_sample;
  int samples_per_pixel;
  int columns;
  
  if (argc == 7) {
    filter = argv[1];
    iVar1 = strcmp(argv[2],"encode");
    filename = argv[3];
    columns = QUtil::string_to_int(argv[4]);
    samples_per_pixel = QUtil::string_to_int(argv[5]);
    bits_per_sample = QUtil::string_to_int(argv[6]);
    columns_00 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&columns);
    bits_per_sample_00 =
         QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&bits_per_sample);
    samples_per_pixel_00 =
         QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&samples_per_pixel);
    run(filename,filter,iVar1 == 0,columns_00,bits_per_sample_00,samples_per_pixel_00);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: predictor {png|tiff} {en,de}code filename")
  ;
  poVar2 = std::operator<<(poVar2," columns samples-per-pixel bits-per-sample");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 7) {
        std::cerr << "Usage: predictor {png|tiff} {en,de}code filename"
                  << " columns samples-per-pixel bits-per-sample" << std::endl;
        exit(2);
    }
    char* filter = argv[1];
    bool encode = (strcmp(argv[2], "encode") == 0);
    char* filename = argv[3];
    int columns = QUtil::string_to_int(argv[4]);
    int samples_per_pixel = QUtil::string_to_int(argv[5]);
    int bits_per_sample = QUtil::string_to_int(argv[6]);

    try {
        run(filename,
            filter,
            encode,
            QIntC::to_uint(columns),
            QIntC::to_uint(bits_per_sample),
            QIntC::to_uint(samples_per_pixel));
    } catch (std::exception& e) {
        std::cout << e.what() << std::endl;
    }
    return 0;
}